

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int diff(int argc,char **argv)

{
  PixelFormat PVar1;
  int iVar2;
  FILE *__stream;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  Allocator AVar7;
  RGBColorSpace *this;
  RGBColorSpace *cs;
  Tuple2<pbrt::Point2,_int> TVar8;
  PixelFormat PVar9;
  ImageAndMetadata *ref;
  int iVar10;
  ulong uVar11;
  long lVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *n;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *n_00;
  uint uVar13;
  uint uVar14;
  char *msg;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *onError;
  Point2i p;
  int c;
  undefined1 auVar15 [16];
  Float FVar16;
  Float FVar17;
  aligned_storage_t<sizeof(float),_alignof(float)> aVar18;
  span<int> out;
  char *local_840;
  array<int,_4UL> cropWindow;
  Float imageAverage;
  Float refAverage;
  string deltaString;
  char **argv_local;
  ulong local_7e0;
  float delta;
  string imageFile;
  string metric;
  ImageChannelValues error;
  WrapMode2D local_758;
  WrapMode2D local_750;
  string referenceFile;
  _Any_data local_728;
  code *local_718;
  code *local_710;
  _Any_data local_708;
  code *local_6f8;
  code *local_6f0;
  _Any_data local_6e8;
  code *local_6d8;
  code *local_6d0;
  string outFile;
  _Any_data local_6a8;
  code *local_698;
  code *local_690;
  aligned_storage_t<sizeof(float),_alignof(float)> local_688;
  bool bStack_684;
  undefined3 uStack_683;
  undefined1 auStack_680 [64];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 uStack_600;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_5f8;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  optional<int> oStack_5d8;
  optional<float> oStack_5d0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_5c8;
  undefined8 uStack_5c0;
  _Rb_tree_impl<std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_5b8;
  ColorEncodingHandle local_588;
  ColorEncodingHandle local_580;
  Image diffImage;
  ImageAndMetadata im;
  ImageAndMetadata refRead;
  
  outFile._M_dataplus._M_p = (pointer)&outFile.field_2;
  onError = (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
             *)&imageFile.field_2;
  referenceFile._M_dataplus._M_p = (pointer)&referenceFile.field_2;
  outFile._M_string_length = 0;
  imageFile._M_string_length = 0;
  referenceFile._M_string_length = 0;
  outFile.field_2._M_local_buf[0] = '\0';
  imageFile.field_2._M_local_buf[0] = '\0';
  referenceFile.field_2._M_local_buf[0] = '\0';
  argv_local = argv;
  imageFile._M_dataplus._M_p = (pointer)onError;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&metric,"MSE",(allocator<char> *)&refRead);
  local_840 = "%s: unknown command flag";
  cropWindow._M_elems[0] = _DAT_0042c180;
  cropWindow._M_elems[1] = _UNK_0042c184;
  cropWindow._M_elems[2] = _UNK_0042c188;
  cropWindow._M_elems[3] = _UNK_0042c18c;
LAB_0025d863:
  do {
    if (*argv == (char *)0x0) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&refRead,"outfile",(allocator<char> *)&error);
    local_6e8._M_unused._M_object = (void *)0x0;
    local_6e8._8_8_ = 0;
    local_6d0 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                ::_M_invoke;
    local_6d8 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                ::_M_manager;
    bVar5 = pbrt::ParseArg<std::__cxx11::string*>
                      (&argv_local,(string *)&refRead,&outFile,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_6e8);
    if (bVar5) {
LAB_0025d931:
      std::_Function_base::~_Function_base((_Function_base *)&local_6e8);
      std::__cxx11::string::~string((string *)&refRead);
      argv = argv_local;
      goto LAB_0025d863;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&im,"reference",(allocator<char> *)&deltaString);
    local_728._M_unused._M_object = (void *)0x0;
    local_728._8_8_ = 0;
    local_710 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                ::_M_invoke;
    local_718 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                ::_M_manager;
    bVar5 = pbrt::ParseArg<std::__cxx11::string*>
                      (&argv_local,(string *)&im,&referenceFile,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_728);
    if (bVar5) {
      std::_Function_base::~_Function_base((_Function_base *)&local_728);
      std::__cxx11::string::~string((string *)&im);
      goto LAB_0025d931;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&diffImage,"metric",(allocator<char> *)&refAverage);
    local_708._M_unused._M_object = (void *)0x0;
    local_708._8_8_ = 0;
    local_6f0 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                ::_M_invoke;
    local_6f8 = std::
                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                ::_M_manager;
    bVar5 = pbrt::ParseArg<std::__cxx11::string*>
                      (&argv_local,(string *)&diffImage,&metric,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)&local_708);
    bVar6 = true;
    if (!bVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_688,"crop",(allocator<char> *)&imageAverage);
      local_6a8._M_unused._M_object = (void *)0x0;
      local_6a8._8_8_ = 0;
      local_690 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                  ::_M_invoke;
      local_698 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                  ::_M_manager;
      out.n = (size_t)&local_6a8;
      out.ptr = (int *)0x4;
      bVar6 = pbrt::ParseArg<pstd::span<int>>
                        ((pbrt *)&argv_local,(char ***)&local_688,(string *)&cropWindow,out,onError)
      ;
      std::_Function_base::~_Function_base((_Function_base *)&local_6a8);
      std::__cxx11::string::~string((string *)&local_688);
    }
    std::_Function_base::~_Function_base((_Function_base *)&local_708);
    std::__cxx11::string::~string((string *)&diffImage);
    std::_Function_base::~_Function_base((_Function_base *)&local_728);
    std::__cxx11::string::~string((string *)&im);
    std::_Function_base::~_Function_base((_Function_base *)&local_6e8);
    std::__cxx11::string::~string((string *)&refRead);
    argv = argv_local;
    if (bVar6 == false) {
      if (**argv_local != '-') {
        if (imageFile._M_string_length == 0) {
          std::__cxx11::string::assign((char *)&imageFile);
          argv = argv_local + 1;
          argv_local = argv;
          goto LAB_0025d863;
        }
        local_840 = "%s: excess argument";
      }
      usage("diff",local_840);
    }
  } while( true );
  if (imageFile._M_string_length == 0) {
    msg = "must specify image to compute difference with.";
LAB_0025e4a4:
    usage("diff",msg);
  }
  if (referenceFile._M_string_length == 0) {
    msg = "must specify --reference image";
    goto LAB_0025e4a4;
  }
  bVar5 = std::operator!=(&metric,"L1");
  if (((bVar5) && (bVar5 = std::operator!=(&metric,"MSE"), bVar5)) &&
     (bVar5 = std::operator!=(&metric,"MRSE"), bVar5)) {
    usage("diff","%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",metric._M_dataplus._M_p);
  }
  AVar7.memoryResource = pstd::pmr::new_delete_resource();
  local_580.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&refRead,&referenceFile,AVar7,&local_580);
  PVar9 = cropWindow._M_elems[1];
  if (cropWindow._M_elems[1] < 0) {
    PVar9 = cropWindow._M_elems[0] - cropWindow._M_elems[1];
    cropWindow._M_elems[1] = PVar9;
  }
  iVar10 = cropWindow._M_elems[3];
  if (cropWindow._M_elems[3] < 0) {
    iVar10 = cropWindow._M_elems[2] - cropWindow._M_elems[3];
    cropWindow._M_elems[3] = iVar10;
  }
  if ((-1 < cropWindow._M_elems[0]) && (-1 < cropWindow._M_elems[2])) {
    PVar1 = cropWindow._M_elems[0];
    if ((int)PVar9 < cropWindow._M_elems[0]) {
      PVar1 = PVar9;
    }
    iVar2 = cropWindow._M_elems[2];
    if (iVar10 < cropWindow._M_elems[2]) {
      iVar2 = iVar10;
    }
    diffImage.resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar2;
    diffImage.format = PVar1;
    if ((int)PVar9 < cropWindow._M_elems[0]) {
      PVar9 = cropWindow._M_elems[0];
    }
    if (iVar10 < cropWindow._M_elems[2]) {
      iVar10 = cropWindow._M_elems[2];
    }
    diffImage._12_4_ = iVar10;
    diffImage.resolution.super_Tuple2<pbrt::Point2,_int>.y = PVar9;
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Image::Crop(&im.image,&refRead.image,(Bounds2i *)&diffImage,AVar7);
    pbrt::Image::operator=(&refRead.image,&im.image);
    pbrt::Image::~Image(&im.image);
  }
  AVar7.memoryResource = pstd::pmr::new_delete_resource();
  local_588.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&im,&imageFile,AVar7,&local_588);
  if ((-1 < cropWindow._M_elems[0]) && (-1 < cropWindow._M_elems[2])) {
    aVar18 = (aligned_storage_t<sizeof(float),_alignof(float)>)cropWindow._M_elems[0];
    if (cropWindow._M_elems[1] < cropWindow._M_elems[0]) {
      aVar18 = (aligned_storage_t<sizeof(float),_alignof(float)>)cropWindow._M_elems[1];
    }
    iVar10 = cropWindow._M_elems[2];
    if (cropWindow._M_elems[3] < cropWindow._M_elems[2]) {
      iVar10 = cropWindow._M_elems[3];
    }
    _bStack_684 = iVar10;
    local_688 = aVar18;
    iVar10 = cropWindow._M_elems[1];
    if (cropWindow._M_elems[1] < cropWindow._M_elems[0]) {
      iVar10 = cropWindow._M_elems[0];
    }
    iVar2 = cropWindow._M_elems[3];
    if (cropWindow._M_elems[3] < cropWindow._M_elems[2]) {
      iVar2 = cropWindow._M_elems[2];
    }
    auStack_680._4_4_ = iVar2;
    auStack_680._0_4_ = iVar10;
    AVar7.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Image::Crop(&diffImage,&im.image,(Bounds2i *)&local_688,AVar7);
    pbrt::Image::operator=(&im.image,&diffImage);
    pbrt::Image::~Image(&diffImage);
  }
  if ((im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x ==
       refRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.x) &&
     (im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y ==
      refRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.y)) {
    if ((int)im.image.channelNames.nStored == (int)refRead.image.channelNames.nStored) {
      pbrt::Image::ChannelNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&diffImage,&im.image);
      pbrt::Image::ChannelNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_688,&refRead.image);
      bVar5 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&diffImage,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_688);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_688);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&diffImage);
      _Var3 = imageFile._M_dataplus;
      __stream = _stderr;
      if (bVar5) {
        pbrt::Image::ChannelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&error,&im.image);
        diff::anon_class_1_0_00000001::operator()
                  ((string *)&diffImage,(anon_class_1_0_00000001 *)&error,n);
        uVar4 = diffImage._0_8_;
        pbrt::Image::ChannelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&deltaString,&refRead.image);
        diff::anon_class_1_0_00000001::operator()
                  ((string *)&local_688,(anon_class_1_0_00000001 *)&deltaString,n_00);
        fprintf(__stream,
                "Warning: image channel names don\'t match: %s has \"%s\" but reference has \"%s\".\n"
                ,_Var3._M_p,uVar4,_local_688);
        std::__cxx11::string::~string((string *)&local_688);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&deltaString);
        std::__cxx11::string::~string((string *)&diffImage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error);
      }
      this = pbrt::ImageMetadata::GetColorSpace(&im.metadata);
      cs = pbrt::ImageMetadata::GetColorSpace(&refRead.metadata);
      bVar5 = pbrt::RGBColorSpace::operator!=(this,cs);
      if (bVar5) {
        fwrite("Warning: computing difference of images with different color spaces!",0x44,1,_stderr
              );
      }
      uVar14 = 0;
      uVar13 = 0;
      TVar8 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
      for (lVar12 = 0; lVar12 < (long)TVar8 >> 0x20; lVar12 = lVar12 + 1) {
        local_7e0 = lVar12 << 0x20;
        for (uVar11 = 0; (long)uVar11 < (long)TVar8.x; uVar11 = uVar11 + 1) {
          p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_7e0 | uVar11);
          for (iVar10 = 0; iVar10 < (int)im.image.channelNames.nStored; iVar10 = iVar10 + 1) {
            pbrt::WrapMode2D::WrapMode2D(&local_750,Clamp);
            FVar16 = pbrt::Image::GetChannel(&im.image,p,iVar10,local_750);
            if (ABS(FVar16) == INFINITY) {
              pbrt::Image::SetChannel(&im.image,p,iVar10,0.0);
              uVar14 = uVar14 + 1;
            }
            pbrt::WrapMode2D::WrapMode2D(&local_758,Clamp);
            FVar16 = pbrt::Image::GetChannel(&refRead.image,p,iVar10,local_758);
            if (ABS(FVar16) == INFINITY) {
              pbrt::Image::SetChannel(&refRead.image,p,iVar10,0.0);
              uVar13 = uVar13 + 1;
            }
          }
          TVar8 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
        }
      }
      if (0 < (int)uVar14) {
        fprintf(_stderr,"%s: clamped %d infinite pixel values.\n",imageFile._M_dataplus._M_p,
                (ulong)uVar14);
      }
      if (0 < (int)uVar13) {
        fprintf(_stderr,"%s: clamped %d infinite pixel values.\n",referenceFile._M_dataplus._M_p,
                (ulong)uVar13);
      }
      AVar7.memoryResource = pstd::pmr::new_delete_resource();
      pbrt::Image::Image(&diffImage,AVar7);
      pbrt::ImageChannelValues::ImageChannelValues
                (&error,(long)(int)refRead.image.channelNames.nStored,0.0);
      bVar5 = std::operator==(&metric,"L1");
      if (bVar5) {
        pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&im.image);
        ref = &refRead;
        pbrt::Image::L1Error
                  ((ImageChannelValues *)&local_688,&im.image,(ImageChannelDesc *)&deltaString,
                   &ref->image,&diffImage);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
                   (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&local_688);
      }
      else {
        bVar5 = std::operator==(&metric,"MSE");
        if (bVar5) {
          pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&im.image);
          ref = &refRead;
          pbrt::Image::MSE((ImageChannelValues *)&local_688,&im.image,
                           (ImageChannelDesc *)&deltaString,&ref->image,&diffImage);
          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    (&error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
                     (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&local_688
                    );
        }
        else {
          pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&im.image);
          ref = &refRead;
          pbrt::Image::MRSE((ImageChannelValues *)&local_688,&im.image,
                            (ImageChannelDesc *)&deltaString,&ref->image,&diffImage);
          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    (&error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
                     (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&local_688
                    );
        }
      }
      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&local_688);
      pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&deltaString);
      FVar16 = pbrt::ImageChannelValues::MaxValue(&error);
      iVar10 = 0;
      if ((FVar16 != 0.0) || (NAN(FVar16))) {
        pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&refRead.image);
        pbrt::Image::Average
                  ((ImageChannelValues *)&local_688,&refRead.image,(ImageChannelDesc *)&deltaString)
        ;
        FVar16 = pbrt::ImageChannelValues::Average((ImageChannelValues *)&local_688);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&local_688);
        pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                  ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&deltaString);
        refAverage = FVar16;
        pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&im.image);
        pbrt::Image::Average
                  ((ImageChannelValues *)&local_688,&im.image,(ImageChannelDesc *)&deltaString);
        FVar17 = pbrt::ImageChannelValues::Average((ImageChannelValues *)&local_688);
        local_7e0 = CONCAT44(local_7e0._4_4_,FVar17);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                  ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)&local_688);
        pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                  ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)&deltaString);
        imageAverage = (float)local_7e0;
        delta = (((float)local_7e0 - FVar16) * 100.0) / FVar16;
        pbrt::StringPrintf<float&>(&deltaString,(pbrt *)"%f%% delta",(char *)&delta,(float *)ref);
        auVar15._8_4_ = 0x7fffffff;
        auVar15._0_8_ = 0x7fffffff7fffffff;
        auVar15._12_4_ = 0x7fffffff;
        auVar15 = vandps_avx512vl(ZEXT416((uint)delta),auVar15);
        if (auVar15._0_4_ <= 0.1) {
          if (0.001 < auVar15._0_4_) {
            pbrt::Yellow((string *)&local_688,&deltaString);
            goto LAB_0025e1a5;
          }
        }
        else {
          pbrt::Red((string *)&local_688,&deltaString);
LAB_0025e1a5:
          std::__cxx11::string::operator=((string *)&deltaString,(string *)&local_688);
          std::__cxx11::string::~string((string *)&local_688);
        }
        aVar18 = (aligned_storage_t<sizeof(float),_alignof(float)>)
                 pbrt::ImageChannelValues::Average(&error);
        local_688 = aVar18;
        pbrt::
        Printf<std::__cxx11::string&,std::__cxx11::string&,float&,float&,std::__cxx11::string&,std::__cxx11::string&,float>
                  ("Images differ:\n\t%s %s\n\tavg = %f / %f (%s), %s = %f\n",&imageFile,
                   &referenceFile,&imageAverage,&refAverage,&deltaString,&metric,(float *)&local_688
                  );
        if (outFile._M_string_length != 0) {
          _Stack_5b8.super__Rb_tree_header._M_header._M_left =
               &_Stack_5b8.super__Rb_tree_header._M_header;
          aStack_5c8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                        )0x0;
          uStack_5c0._0_1_ = false;
          uStack_5c0._1_7_ = 0;
          _Stack_5b8._0_8_ = 0;
          _Stack_5b8.super__Rb_tree_header._M_header._M_color = _S_red;
          _Stack_5b8.super__Rb_tree_header._M_header._4_4_ = 0;
          _Stack_5b8.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          uStack_608 = 0;
          uStack_600 = 0;
          aStack_5f8._0_8_ = 0;
          aStack_5f8._8_8_ = 0;
          uStack_5e8 = 0;
          local_5e0 = 0;
          oStack_5d8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          oStack_5d8.set = false;
          oStack_5d8._5_3_ = 0;
          oStack_5d0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          oStack_5d0.set = false;
          oStack_5d0._5_3_ = 0;
          auStack_680._56_8_ = 0;
          uStack_640 = 0;
          uStack_638 = 0;
          uStack_630 = 0;
          uStack_628 = 0;
          uStack_620 = 0;
          uStack_618 = 0;
          uStack_610 = 0;
          local_688 = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          bStack_684 = false;
          uStack_683 = 0;
          auStack_680._0_4_ = 0;
          auStack_680._4_4_ = 0;
          auStack_680._8_8_ = (pointer)0x0;
          auStack_680._16_8_ = 0;
          auStack_680._24_8_ = 0;
          auStack_680._32_8_ = 0;
          auStack_680._40_8_ = 0;
          auStack_680._48_8_ = 0;
          _Stack_5b8.super__Rb_tree_header._M_node_count = 0;
          _Stack_5b8.super__Rb_tree_header._M_header._M_right =
               _Stack_5b8.super__Rb_tree_header._M_header._M_left;
          pbrt::Image::Write(&diffImage,&outFile,(ImageMetadata *)&local_688);
          pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)&local_688);
        }
        std::__cxx11::string::~string((string *)&deltaString);
        iVar10 = 1;
      }
      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                (&error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>);
      pbrt::Image::~Image(&diffImage);
      goto LAB_0025e2a5;
    }
    fprintf(_stderr,"%s: image channel count %d doesn\'t match reference %d.\n",
            imageFile._M_dataplus._M_p);
  }
  else {
    fprintf(_stderr,"%s: image resolution (%d, %d) doesn\'t match reference (%d, %d)\n",
            imageFile._M_dataplus._M_p);
  }
  iVar10 = 1;
LAB_0025e2a5:
  pbrt::ImageAndMetadata::~ImageAndMetadata(&im);
  pbrt::ImageAndMetadata::~ImageAndMetadata(&refRead);
  std::__cxx11::string::~string((string *)&metric);
  std::__cxx11::string::~string((string *)&referenceFile);
  std::__cxx11::string::~string((string *)&imageFile);
  std::__cxx11::string::~string((string *)&outFile);
  return iVar10;
}

Assistant:

int diff(int argc, char *argv[]) {
    std::string outFile, imageFile, referenceFile, metric = "MSE";
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("diff", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "reference", &referenceFile, onError) ||
            ParseArg(&argv, "metric", &metric, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError)) {
            // success
        } else if (argv[0][0] == '-') {
            usage("diff", "%s: unknown command flag", *argv);
        } else if (!imageFile.empty()) {
            usage("diff", "%s: excess argument", *argv);
        } else {
            imageFile = *argv;
            ++argv;
        }
    }

    if (imageFile.empty())
        usage("diff", "must specify image to compute difference with.");

    if (referenceFile.empty())
        usage("diff", "must specify --reference image");

    if (metric != "L1" && metric != "MSE" && metric != "MRSE")
        usage("diff", "%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",
              metric.c_str());

    ImageAndMetadata refRead = Image::Read(referenceFile);
    Image &refImage = refRead.image;
    const ImageMetadata &refMetadata = refRead.metadata;

    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
        refImage = refImage.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));

    ImageAndMetadata im = Image::Read(imageFile);
    Image &image = im.image;

    // Crop before comparing resolutions.
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
        image = image.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));

    if (image.Resolution() != refImage.Resolution()) {
        fprintf(stderr,
                "%s: image resolution (%d, %d) doesn't match reference (%d, %d)\n",
                imageFile.c_str(), image.Resolution().x, image.Resolution().y,
                refImage.Resolution().x, refImage.Resolution().y);
        return 1;
    }
    if (image.NChannels() != refImage.NChannels()) {
        fprintf(stderr, "%s: image channel count %d doesn't match reference %d.\n",
                imageFile.c_str(), image.NChannels(), refImage.NChannels());
        return 1;
    }

    if (image.ChannelNames() != refImage.ChannelNames()) {
        auto print = [](const std::vector<std::string> &n) {
            std::string s = n[0];
            for (size_t i = 1; i < n.size(); ++i) {
                s += ", ";
                s += n[i];
            }
            return s;
        };
        fprintf(stderr,
                "Warning: image channel names don't match: %s has \"%s\" "
                "but reference has \"%s\".\n",
                imageFile.c_str(), print(image.ChannelNames()).c_str(),
                print(refImage.ChannelNames()).c_str());
    }

    if (*im.metadata.GetColorSpace() != *refMetadata.GetColorSpace())
        fprintf(stderr, "Warning: computing difference of images with different "
                        "color spaces!");

    // Clamp Infs
    int nClamped = 0, nRefClamped = 0;
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x)
            for (int c = 0; c < image.NChannels(); ++c) {
                if (std::isinf(image.GetChannel({x, y}, c))) {
                    ++nClamped;
                    image.SetChannel({x, y}, c, 0);
                }
                if (std::isinf(refImage.GetChannel({x, y}, c))) {
                    ++nRefClamped;
                    refImage.SetChannel({x, y}, c, 0);
                }
            }
    if (nClamped > 0)
        fprintf(stderr, "%s: clamped %d infinite pixel values.\n", imageFile.c_str(),
                nClamped);
    if (nRefClamped > 0)
        fprintf(stderr, "%s: clamped %d infinite pixel values.\n", referenceFile.c_str(),
                nRefClamped);

    Image diffImage;
    ImageChannelValues error(refImage.NChannels());
    if (metric == "L1")
        error = image.L1Error(image.AllChannelsDesc(), refImage, &diffImage);
    else if (metric == "MSE")
        error = image.MSE(image.AllChannelsDesc(), refImage, &diffImage);
    else
        error = image.MRSE(image.AllChannelsDesc(), refImage, &diffImage);

    if (error.MaxValue() == 0)
        // Same same.
        return 0;

    // Image averages
    Float refAverage = refImage.Average(refImage.AllChannelsDesc()).Average();
    Float imageAverage = image.Average(image.AllChannelsDesc()).Average();

    float delta = 100.f * (imageAverage - refAverage) / refAverage;
    std::string deltaString = StringPrintf("%f%% delta", delta);
    if (std::abs(delta) > 0.1)
        deltaString = Red(deltaString);
    else if (std::abs(delta) > 0.001)
        deltaString = Yellow(deltaString);
    Printf("Images differ:\n\t%s %s\n\tavg = %f / %f (%s), %s = %f\n", imageFile,
           referenceFile, imageAverage, refAverage, deltaString, metric, error.Average());

    if (!outFile.empty()) {
        if (!diffImage.Write(outFile))
            return 1;
    }

    return 1;
}